

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

Status __thiscall
osqp::OsqpSolver::Init(OsqpSolver *this,OsqpInstance *instance,OsqpSettings *settings)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  string_view right_name;
  string_view right_name_00;
  string_view right_name_01;
  string_view right_name_02;
  string_view right_name_03;
  ulong uVar4;
  c_float *in_RCX;
  int right_value;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view left_name;
  string_view left_name_00;
  string_view left_name_01;
  string_view left_name_02;
  string_view left_name_03;
  char *pcStackY_280;
  OSQPWorkspace *workspace;
  VectorXd clipped_upper_bounds;
  VectorXd clipped_lower_bounds;
  SparseMatrix<double,_0,_long_long> objective_matrix_upper_triangle;
  OSQPData data;
  OSQPSettings osqp_settings;
  undefined1 local_a0 [48];
  c_int local_70;
  undefined1 local_68 [48];
  c_int local_38;
  
  if (settings->adaptive_rho_interval != 0) {
    pcStackY_280 = (char *)0x3c;
LAB_0014efad:
    message._M_str = pcStackY_280;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    return (Status)this;
  }
  if (settings->polish_refine_iter != 0) {
    pcStackY_280 = (char *)0x3d;
    goto LAB_0014efad;
  }
  dVar2 = settings->alpha;
  dVar3 = settings->delta;
  right_value = SUB84(dVar2,0);
  right_name._M_str = "num_variables";
  right_name._M_len = 0xd;
  left_name._M_str = "instance.objective_matrix.cols()";
  left_name._M_len = 0x20;
  anon_unknown_6::CheckDimensions
            ((anon_unknown_6 *)this,*(int *)&settings->sigma,right_value,left_name,right_name);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  right_name_00._M_str = "num_variables";
  right_name_00._M_len = 0xd;
  left_name_00._M_str = "instance.objective_matrix.rows()";
  left_name_00._M_len = 0x20;
  anon_unknown_6::CheckDimensions
            ((anon_unknown_6 *)this,(int)settings->scaling,right_value,left_name_00,right_name_00);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  right_name_01._M_str = "num_variables";
  right_name_01._M_len = 0xd;
  left_name_01._M_str = "instance.objective_vector.size()";
  left_name_01._M_len = 0x20;
  anon_unknown_6::CheckDimensions
            ((anon_unknown_6 *)this,*(int *)&settings->eps_prim_inf,right_value,left_name_01,
             right_name_01);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  right_name_02._M_str = "num_constraints";
  right_name_02._M_len = 0xf;
  left_name_02._M_str = "instance.lower_bounds.size()";
  left_name_02._M_len = 0x1c;
  anon_unknown_6::CheckDimensions
            ((anon_unknown_6 *)this,*(int *)&settings[1].sigma,SUB84(dVar3,0),left_name_02,
             right_name_02);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  right_name_03._M_str = "num_constraints";
  right_name_03._M_len = 0xf;
  left_name_03._M_str = "instance.upper_bounds.size()";
  left_name_03._M_len = 0x1c;
  anon_unknown_6::CheckDimensions
            ((anon_unknown_6 *)this,*(int *)&settings[1].adaptive_rho,SUB84(dVar3,0),left_name_03,
             right_name_03);
  if ((this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl !=
      (OSQPWorkspaceHelper *)0x1) {
    return (Status)this;
  }
  absl::Status::~Status((Status *)this);
  objective_matrix_upper_triangle.
  super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)0xea;
  objective_matrix_upper_triangle._1_7_ = 0xc6293e5939a08c;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMax
            ((CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&osqp_settings,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(settings + 1)
             ,(Scalar *)&objective_matrix_upper_triangle);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&clipped_lower_bounds,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&osqp_settings);
  objective_matrix_upper_triangle.
  super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)0xea;
  objective_matrix_upper_triangle._1_7_ = 0x46293e5939a08c;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMin
            ((CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&osqp_settings,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&settings[1].scaling,
             (Scalar *)&objective_matrix_upper_triangle);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&clipped_upper_bounds,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&osqp_settings);
  osqp_settings.rho = (c_float)((ulong)osqp_settings.rho & 0xffffffffffffff00);
  data.n = (c_int)dVar2;
  data.m = (c_int)dVar3;
  osqp_settings.sigma = (c_float)settings;
  Eigen::SparseMatrix<double,0,long_long>::
  SparseMatrix<Eigen::TriangularView<Eigen::SparseMatrix<double,0,long_long>const,2u>>
            ((SparseMatrix<double,0,long_long> *)&objective_matrix_upper_triangle,
             (SparseMatrixBase<Eigen::TriangularView<const_Eigen::SparseMatrix<double,_0,_long_long>,_2U>_>
              *)&osqp_settings);
  local_68._0_8_ = objective_matrix_upper_triangle.m_outerIndex[(long)dVar2];
  data.P = (csc *)local_68;
  local_68._24_8_ = objective_matrix_upper_triangle.m_outerIndex;
  local_68._32_8_ = objective_matrix_upper_triangle.m_data.m_indices;
  local_68._40_4_ = (int)objective_matrix_upper_triangle.m_data.m_values;
  local_68._44_4_ = objective_matrix_upper_triangle.m_data.m_values._4_4_;
  local_38 = -1;
  local_a0._24_8_ = *(undefined8 *)&settings->polish;
  local_a0._0_8_ = *(c_int *)(local_a0._24_8_ + dVar2 * 8);
  data.A = (csc *)local_a0;
  auVar1[0] = settings->verbose;
  auVar1[1] = settings->scaled_termination;
  auVar1._2_6_ = *(undefined6 *)&settings->field_0x82;
  auVar1._8_8_ = settings->check_termination;
  local_a0._40_4_ = auVar1._0_4_;
  local_a0._32_8_ = auVar1._8_8_;
  local_a0._44_4_ = (int)((uint6)auVar1._2_6_ >> 0x10);
  local_70 = -1;
  data.q = (c_float *)settings->eps_rel;
  data.l = clipped_lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  data.u = clipped_upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  osqp_settings.rho = *in_RCX;
  osqp_settings.sigma = in_RCX[1];
  osqp_settings.scaling = (c_int)in_RCX[2];
  osqp_settings.adaptive_rho = (c_int)*(byte *)(in_RCX + 3);
  osqp_settings.adaptive_rho_interval = (c_int)in_RCX[4];
  osqp_settings.adaptive_rho_tolerance = in_RCX[5];
  osqp_settings.adaptive_rho_fraction = in_RCX[6];
  osqp_settings.max_iter = (c_int)in_RCX[7];
  osqp_settings.eps_abs = in_RCX[8];
  osqp_settings.eps_rel = in_RCX[9];
  osqp_settings.eps_prim_inf = in_RCX[10];
  osqp_settings.eps_dual_inf = in_RCX[0xb];
  osqp_settings.alpha = in_RCX[0xc];
  osqp_settings.delta = in_RCX[0xd];
  osqp_settings.polish = (c_int)*(byte *)(in_RCX + 0xe);
  osqp_settings.polish_refine_iter = (c_int)in_RCX[0xf];
  osqp_settings.verbose = (c_int)*(byte *)(in_RCX + 0x10);
  osqp_settings.scaled_termination = (c_int)*(byte *)((long)in_RCX + 0x81);
  osqp_settings.check_termination = (c_int)in_RCX[0x11];
  osqp_settings.warm_start = (c_int)*(byte *)(in_RCX + 0x12);
  osqp_settings.time_limit = in_RCX[0x13];
  osqp_settings.linsys_solver = QDLDL_SOLVER;
  workspace = (OSQPWorkspace *)0x0;
  local_a0._8_8_ = dVar3;
  local_a0._16_8_ = dVar2;
  local_68._8_8_ = dVar2;
  local_68._16_8_ = dVar2;
  uVar4 = osqp_setup(&workspace,&data,&osqp_settings);
  std::__uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::reset
            ((__uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)instance,
             (pointer)workspace);
  switch(uVar4 & 0xffffffff) {
  case 0:
    (this->workspace_)._M_t.
    super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
    super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
    super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
         (OSQPWorkspaceHelper *)0x1;
    goto LAB_0014f41d;
  case 1:
    pcStackY_280 = (char *)0x31;
    goto LAB_0014f3f7;
  case 2:
    pcStackY_280 = (char *)0x2c;
    goto LAB_0014f3f7;
  case 3:
    pcStackY_280 = (char *)0x38;
    break;
  case 4:
    pcStackY_280 = (char *)0x3e;
    break;
  case 5:
    pcStackY_280 = (char *)0x3a;
LAB_0014f3f7:
    message_00._M_str = pcStackY_280;
    message_00._M_len = (size_t)this;
    absl::InvalidArgumentError(message_00);
    goto LAB_0014f41d;
  case 6:
  default:
    pcStackY_280 = (char *)0x33;
    break;
  case 7:
    pcStackY_280 = (char *)0x35;
  }
  message_01._M_str = pcStackY_280;
  message_01._M_len = (size_t)this;
  absl::UnknownError(message_01);
LAB_0014f41d:
  Eigen::SparseMatrix<double,_0,_long_long>::~SparseMatrix(&objective_matrix_upper_triangle);
  free(clipped_upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_data);
  free(clipped_lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_data);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::Init(const OsqpInstance& instance,
                              const OsqpSettings& settings) {
  if (!instance.objective_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "objective_matrix must be compressed (call makeCompressed()).");
  }
  if (!instance.constraint_matrix.isCompressed()) {
    return absl::InvalidArgumentError(
        "constraint_matrix must be compressed (call makeCompressed()).");
  }
  const c_int num_variables = instance.num_variables();
  const c_int num_constraints = instance.num_constraints();

  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.cols(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_matrix.rows(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.objective_vector.size(), num_variables));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.lower_bounds.size(), num_constraints));
  OSQP_RETURN_IF_ERROR(
      OSQP_CHECK_DIMENSIONS(instance.upper_bounds.size(), num_constraints));

  // Clip bounds using OSQP_INFTY. Failing to do this causes subtle convergence
  // issues instead of producing explicit errors (e.g., the
  // DetectsPrimalInfeasible test fails). The osqp-python interface also clips
  // the bounds in the same way.
  VectorXd clipped_lower_bounds = instance.lower_bounds.cwiseMax(-OSQP_INFTY);
  VectorXd clipped_upper_bounds = instance.upper_bounds.cwiseMin(OSQP_INFTY);

  // OSQP copies all the data, so it's okay to discard this struct after
  // osqp_setup. It also does not modify the input data (note osqp_setup takes a
  // const OSQPData*). const_cast is needed here to fill in the input data
  // structures.
  OSQPData data;
  data.n = num_variables;
  data.m = num_constraints;

  // TODO(ml): This copy could be avoided if the matrix is already upper
  // triangular.
  Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>
      objective_matrix_upper_triangle =
          instance.objective_matrix.triangularView<Eigen::Upper>();

  // OSQP's csc struct represents sparse matrices in compressed sparse column
  // (CSC) format and (confusingly) triplet format. osqp_setup() assumes the
  // input is provided in CSC format. The mapping from Eigen::SparseMatrix's
  // outerIndexPtr(), innerIndexPtr(), and valuePtr() is direct because we
  // require the sparse matrices to be compressed and follow the Eigen::ColMajor
  // storage scheme. For further background, see
  // https://eigen.tuxfamily.org/dox/group__TutorialSparse.html for the
  // description of CSC format in Eigen and osqp/include/types.h for the
  // definition of OSQP's csc struct.
  ::csc objective_matrix = {
      objective_matrix_upper_triangle.outerIndexPtr()[num_variables],
      num_variables,
      num_variables,
      const_cast<c_int*>(objective_matrix_upper_triangle.outerIndexPtr()),
      const_cast<c_int*>(objective_matrix_upper_triangle.innerIndexPtr()),
      const_cast<double*>(objective_matrix_upper_triangle.valuePtr()),
      -1};
  data.P = &objective_matrix;

  ::csc constraint_matrix = {
      instance.constraint_matrix.outerIndexPtr()[num_variables],
      num_constraints,
      num_variables,
      const_cast<c_int*>(instance.constraint_matrix.outerIndexPtr()),
      const_cast<c_int*>(instance.constraint_matrix.innerIndexPtr()),
      const_cast<double*>(instance.constraint_matrix.valuePtr()),
      -1};
  data.A = &constraint_matrix;

  data.q = const_cast<double*>(instance.objective_vector.data());
  data.l = clipped_lower_bounds.data();
  data.u = clipped_upper_bounds.data();

  ::OSQPSettings osqp_settings = ToInternalSettings(settings);

  OSQPWorkspace* workspace = nullptr;
  const int return_code = osqp_setup(&workspace, &data, &osqp_settings);
  workspace_.reset(static_cast<OSQPWorkspaceHelper*>(workspace));
  if (return_code == 0) {
    return absl::OkStatus();
  }
  switch (static_cast<osqp_error_type>(return_code)) {
    case OSQP_DATA_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: data validation error.");
    case OSQP_SETTINGS_VALIDATION_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: invalid settings.");
    case OSQP_LINSYS_SOLVER_LOAD_ERROR:
      // This should never happen because qdldl is statically linked in.
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to load linear solver.");
    case OSQP_LINSYS_SOLVER_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: unable to initialize linear solver.");
    case OSQP_NONCVX_ERROR:
      return absl::InvalidArgumentError(
          "Unable to initialize OSQP: the problem appears non-convex.");
    case OSQP_MEM_ALLOC_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: memory allocation error.");
    case OSQP_WORKSPACE_NOT_INIT_ERROR:
      return absl::UnknownError(
          "Unable to initialize OSQP: workspace not initialized.");
  }
  return absl::UnknownError(
      "Unable to initialize OSQP: unrecognized error code.");
}